

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:212:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:212:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Promise<unsigned_long>_> *pEVar1;
  Type local_5f8;
  ExceptionOr<kj::Promise<unsigned_long>_> local_5e8;
  Void *local_470;
  Void *depValue;
  ExceptionOr<kj::Promise<unsigned_long>_> local_310;
  Exception *local_198;
  Exception *depException;
  undefined1 local_180 [8];
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:212:11),_kj::_::PropagateException>
  *this_local;
  
  depResult._352_8_ = output;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)local_180);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_180);
  local_198 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (local_198 == (Exception *)0x0) {
    local_470 = readMaybe<kj::_::Void>
                          ((Maybe<kj::_::Void> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_470 != (Void *)0x0) {
      mv<kj::_::Void>(local_470);
      MaybeVoidCaller<kj::_::Void,kj::Promise<unsigned_long>>::
      apply<kj::(anonymous_namespace)::TestCase198::run()::__1>(&local_5f8,(Void *)&this->func);
      handle(&local_5e8,this,(Promise<unsigned_long> *)&local_5f8);
      pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>
                         ((ExceptionOrValue *)depResult._352_8_);
      ExceptionOr<kj::Promise<unsigned_long>_>::operator=(pEVar1,&local_5e8);
      ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_5e8);
      Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_5f8);
    }
  }
  else {
    in = mv<kj::Exception>(local_198);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x30,in)
    ;
    handle(&local_310,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>((ExceptionOrValue *)depResult._352_8_)
    ;
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=(pEVar1,&local_310);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_310);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)local_180);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }